

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_address.cpp
# Opt level: O2

void __thiscall zmq::udp_address_t::udp_address_t(udp_address_t *this)

{
  ip_addr_t local_2c;
  
  this->_vptr_udp_address_t = (_func_int **)&PTR__udp_address_t_00247e78;
  this->_bind_interface = -1;
  this->_is_multicast = false;
  (this->_address)._M_dataplus._M_p = (pointer)&(this->_address).field_2;
  (this->_address)._M_string_length = 0;
  (this->_address).field_2._M_local_buf[0] = '\0';
  ip_addr_t::any(&local_2c,2);
  *(ulong *)((long)&this->_bind_address + 0xc) = CONCAT44(local_2c._16_4_,local_2c._12_4_);
  *(undefined8 *)((long)&this->_bind_address + 0x14) = local_2c._20_8_;
  *(undefined8 *)&this->_bind_address = local_2c._0_8_;
  *(ulong *)((long)&this->_bind_address + 8) = CONCAT44(local_2c._12_4_,local_2c._8_4_);
  ip_addr_t::any(&local_2c,2);
  *(ulong *)((long)&this->_target_address + 0xc) = CONCAT44(local_2c._16_4_,local_2c._12_4_);
  *(undefined8 *)((long)&this->_target_address + 0x14) = local_2c._20_8_;
  *(undefined8 *)&this->_target_address = local_2c._0_8_;
  *(ulong *)((long)&this->_target_address + 8) = CONCAT44(local_2c._12_4_,local_2c._8_4_);
  return;
}

Assistant:

zmq::udp_address_t::udp_address_t () :
    _bind_interface (-1),
    _is_multicast (false)
{
    _bind_address = ip_addr_t::any (AF_INET);
    _target_address = ip_addr_t::any (AF_INET);
}